

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

void mp_reduce_mod_2to(mp_int *x,size_t p)

{
  ulong uVar1;
  BignumInt *pBVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = p >> 6;
  uVar1 = x->nw;
  if (uVar3 < uVar1) {
    uVar4 = ~(-1L << ((byte)p & 0x3f));
    pBVar2 = x->w;
    do {
      pBVar2[uVar3] = pBVar2[uVar3] & uVar4;
      uVar3 = uVar3 + 1;
      uVar4 = 0;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void mp_reduce_mod_2to(mp_int *x, size_t p)
{
    size_t word = p / BIGNUM_INT_BITS;
    size_t mask = ((size_t)1 << (p % BIGNUM_INT_BITS)) - 1;
    for (; word < x->nw; word++) {
        x->w[word] &= mask;
        mask = 0;
    }
}